

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int CVodeWFtolerances(void *cvode_mem,CVEwtFn efun)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x310;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x46c) != 0) {
      *(undefined4 *)((long)cvode_mem + 0x24) = 3;
      *(undefined4 *)((long)cvode_mem + 0x44) = 1;
      *(CVEwtFn *)((long)cvode_mem + 0x48) = efun;
      *(undefined8 *)((long)cvode_mem + 0x50) = 0;
      return 0;
    }
    msgfmt = "Attempt to call before CVodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
    line = 0x317;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeWFtolerances",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeWFtolerances(void* cvode_mem, CVEwtFn efun)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    return (CV_NO_MALLOC);
  }

  cv_mem->cv_itol = CV_WF;

  cv_mem->cv_user_efun = SUNTRUE;
  cv_mem->cv_efun      = efun;
  cv_mem->cv_e_data    = NULL; /* will be set to user_data in InitialSetup */

  return (CV_SUCCESS);
}